

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::JUnitReporter::test_case_start(JUnitReporter *this,TestCaseData *in)

{
  long in_RSI;
  string *in_stack_ffffffffffffff58;
  JUnitTestCaseData *this_00;
  char *in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_31 [33];
  long local_10;
  
  local_10 = in_RSI;
  String::c_str((String *)0x13a14c);
  skipPathFromFilename(in_stack_ffffffffffffff68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  this_00 = *(JUnitTestCaseData **)(local_10 + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  JUnitTestCaseData::add(this_00,in_stack_ffffffffffffff58,(string *)0x13a1c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff97);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
  std::allocator<char>::~allocator(local_31);
  detail::Timer::start((Timer *)this_00);
  return;
}

Assistant:

void test_case_start(const TestCaseData& in) override {
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
            timer.start();
        }